

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O2

bool cmSystemTools::SplitProgramFromArgs(string *command,string *program,string *args)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  byte bVar5;
  pointer pcVar6;
  
  pcVar6 = (command->_M_dataplus)._M_p + -1;
  do {
    bVar5 = pcVar6[1];
    pcVar6 = pcVar6 + 1;
    iVar4 = isspace((uint)bVar5);
  } while (iVar4 != 0);
  bVar2 = false;
  bVar3 = false;
  bVar1 = false;
  do {
    if (bVar5 == 0) {
      std::__cxx11::string::assign((char *)args);
      if (!bVar1) {
LAB_00164b06:
        if (!bVar2) {
          return (bool)(bVar3 ^ 1);
        }
      }
      return false;
    }
    if (bVar1) {
      if (bVar5 != 0x27) goto LAB_00164add;
      bVar1 = false;
    }
    else if (bVar2) {
      std::__cxx11::string::push_back((char)program);
      bVar2 = false;
    }
    else if (bVar5 == 0x5c) {
      bVar2 = true;
    }
    else if (bVar3) {
      if (bVar5 == 0x22) {
        bVar3 = false;
      }
      else {
LAB_00164add:
        std::__cxx11::string::push_back((char)program);
      }
    }
    else if (bVar5 == 0x22) {
      bVar3 = true;
    }
    else {
      if (bVar5 != 0x27) {
        iVar4 = isspace((uint)bVar5);
        if (iVar4 == 0) goto LAB_00164add;
        std::__cxx11::string::assign((char *)args);
        goto LAB_00164b06;
      }
      bVar1 = true;
    }
    bVar5 = pcVar6[1];
    pcVar6 = pcVar6 + 1;
  } while( true );
}

Assistant:

bool cmSystemTools::SplitProgramFromArgs(std::string const& command,
                                         std::string& program,
                                         std::string& args)
{
  const char* c = command.c_str();

  // Skip leading whitespace.
  while (isspace(static_cast<unsigned char>(*c))) {
    ++c;
  }

  // Parse one command-line element up to an unquoted space.
  bool in_escape = false;
  bool in_double = false;
  bool in_single = false;
  for (; *c; ++c) {
    if (in_single) {
      if (*c == '\'') {
        in_single = false;
      } else {
        program += *c;
      }
    } else if (in_escape) {
      in_escape = false;
      program += *c;
    } else if (*c == '\\') {
      in_escape = true;
    } else if (in_double) {
      if (*c == '"') {
        in_double = false;
      } else {
        program += *c;
      }
    } else if (*c == '"') {
      in_double = true;
    } else if (*c == '\'') {
      in_single = true;
    } else if (isspace(static_cast<unsigned char>(*c))) {
      break;
    } else {
      program += *c;
    }
  }

  // The remainder of the command line holds unparsed arguments.
  args = c;

  return !in_single && !in_escape && !in_double;
}